

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginGlobalInitExpr(BinaryReaderIR *this,Index index)

{
  Result RVar1;
  size_type sVar2;
  reference ppGVar3;
  Global *global;
  Index index_local;
  BinaryReaderIR *this_local;
  
  sVar2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size
                    (&this->module_->globals);
  if ((ulong)index == sVar2 - 1) {
    ppGVar3 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::operator[]
                        (&this->module_->globals,(ulong)index);
    RVar1 = BeginInitExpr(this,&(*ppGVar3)->init_expr);
    return (Result)RVar1.enum_;
  }
  __assert_fail("index == module_->globals.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x2ef,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginGlobalInitExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginGlobalInitExpr(Index index) {
  assert(index == module_->globals.size() - 1);
  Global* global = module_->globals[index];
  return BeginInitExpr(&global->init_expr);
}